

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O3

drwav_bool32
drwav_init_write__internal
          (drwav *pWav,drwav_data_format *pFormat,drwav_uint64 totalSampleCount,
          drwav_bool32 isSequential,drwav_write_proc onWrite,drwav_seek_proc onSeek,void *pUserData)

{
  drwav_uint32 dVar1;
  drwav_uint32 dVar2;
  uint uVar3;
  drwav_container dVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  uint uVar13;
  ulong uVar14;
  drwav_bool32 dVar15;
  drwav_bool32 dVar16;
  drwav_uint8 *pdVar17;
  long lVar18;
  size_t sVar19;
  drwav_uint64 dVar20;
  drwav_uint64 chunkSizeFMT;
  drwav_uint64 chunkSizeDATA;
  long local_78;
  drwav_data_format *local_70;
  ulong local_68;
  drwav_uint16 *local_60;
  drwav_uint32 *local_58;
  drwav_uint32 *local_50;
  drwav_uint16 *local_48;
  drwav_uint16 *local_40;
  long local_38;
  
  dVar15 = 0;
  dVar16 = 0;
  if ((((onWrite != (drwav_write_proc)0x0 && pWav != (drwav *)0x0) &&
       (dVar16 = dVar15, isSequential != 0 || onSeek != (drwav_seek_proc)0x0)) &&
      (dVar1 = pFormat->format, dVar1 != 2)) && ((dVar1 != 0x11 && (dVar1 != 0xfffe)))) {
    local_70 = pFormat;
    memset(pWav,0,0x1a0);
    pWav->onWrite = onWrite;
    pWav->onSeek = onSeek;
    pWav->pUserData = pUserData;
    (pWav->fmt).formatTag = (drwav_uint16)local_70->format;
    dVar1 = local_70->channels;
    (pWav->fmt).channels = (drwav_uint16)dVar1;
    dVar2 = local_70->sampleRate;
    (pWav->fmt).sampleRate = dVar2;
    uVar3 = local_70->bitsPerSample;
    uVar13 = dVar1 * uVar3;
    (pWav->fmt).avgBytesPerSec = dVar2 * uVar13 >> 3;
    (pWav->fmt).blockAlign = (drwav_uint16)(uVar13 >> 3);
    (pWav->fmt).bitsPerSample = (drwav_uint16)uVar3;
    pWav->isSequentialWrite = isSequential;
    if (isSequential == 0) {
      dVar4 = local_70->container;
      local_68 = 0;
    }
    else {
      uVar14 = (uVar3 & 0xffff) * totalSampleCount;
      local_68 = uVar14 >> 3;
      dVar4 = local_70->container;
      if ((dVar4 == drwav_container_riff) && (0x3ffffff6 < uVar14 >> 5)) {
        return 0;
      }
    }
    pWav->dataChunkDataSizeTargetWrite = local_68;
    if (dVar4 == drwav_container_riff) {
      local_78 = CONCAT44(local_78._4_4_,(int)local_68 + 0x24);
      sVar5 = (*onWrite)(pUserData,"RIFF",4);
      sVar6 = (*pWav->onWrite)(pUserData,&local_78,4);
      lVar18 = sVar6 + sVar5;
      sVar5 = 4;
      pdVar17 = (drwav_uint8 *)"WAVE";
    }
    else {
      local_78 = local_68 + 0x68;
      sVar5 = (*onWrite)(pUserData,drwavGUID_W64_RIFF,0x10);
      sVar6 = (*pWav->onWrite)(pUserData,&local_78,8);
      lVar18 = sVar6 + sVar5;
      pdVar17 = drwavGUID_W64_WAVE;
      sVar5 = 0x10;
    }
    sVar5 = (*pWav->onWrite)(pUserData,pdVar17,sVar5);
    local_60 = &(pWav->fmt).channels;
    local_58 = &(pWav->fmt).sampleRate;
    local_50 = &(pWav->fmt).avgBytesPerSec;
    local_48 = &(pWav->fmt).blockAlign;
    local_40 = &(pWav->fmt).bitsPerSample;
    if (local_70->container == drwav_container_riff) {
      local_78 = 0x10;
      sVar19 = 4;
      sVar6 = (*pWav->onWrite)(pUserData,"fmt ",4);
    }
    else {
      local_78 = 0x28;
      sVar6 = (*pWav->onWrite)(pUserData,drwavGUID_W64_FMT,0x10);
      sVar19 = 8;
    }
    sVar19 = (*pWav->onWrite)(pUserData,&local_78,sVar19);
    sVar7 = (*pWav->onWrite)(pUserData,&pWav->fmt,2);
    sVar8 = (*pWav->onWrite)(pUserData,local_60,2);
    sVar9 = (*pWav->onWrite)(pUserData,local_58,4);
    sVar10 = (*pWav->onWrite)(pUserData,local_50,4);
    sVar11 = (*pWav->onWrite)(pUserData,local_48,2);
    sVar12 = (*pWav->onWrite)(pUserData,local_40,2);
    dVar20 = sVar12 + sVar11 + sVar10 + sVar9 + sVar8 + sVar7 + sVar19 + sVar6 + sVar5 + lVar18;
    pWav->dataChunkDataPos = dVar20;
    if (local_70->container == drwav_container_riff) {
      local_38 = CONCAT44(local_38._4_4_,(int)local_68);
      sVar5 = (*pWav->onWrite)(pUserData,"data",4);
      sVar6 = 4;
    }
    else {
      local_38 = local_68 + 0x18;
      sVar5 = (*pWav->onWrite)(pUserData,drwavGUID_W64_DATA,0x10);
      sVar6 = 8;
    }
    sVar6 = (*pWav->onWrite)(pUserData,&local_38,sVar6);
    if (local_70->container == drwav_container_riff) {
      lVar18 = local_78 + 0x1c;
    }
    else {
      lVar18 = local_78 + 0x40;
    }
    if (sVar6 + sVar5 + dVar20 == lVar18) {
      pWav->container = local_70->container;
      pWav->channels = (drwav_uint16)local_70->channels;
      pWav->sampleRate = local_70->sampleRate;
      pWav->bitsPerSample = (drwav_uint16)local_70->bitsPerSample;
      pWav->translatedFormatTag = (drwav_uint16)local_70->format;
      dVar16 = 1;
    }
    else {
      dVar16 = 0;
    }
  }
  return dVar16;
}

Assistant:

drwav_bool32 drwav_init_write__internal(drwav* pWav, const drwav_data_format* pFormat, drwav_uint64 totalSampleCount, drwav_bool32 isSequential, drwav_write_proc onWrite, drwav_seek_proc onSeek, void* pUserData)
{
    if (pWav == NULL) {
        return DRWAV_FALSE;
    }

    if (onWrite == NULL) {
        return DRWAV_FALSE;
    }

    if (!isSequential && onSeek == NULL) {
        return DRWAV_FALSE; // <-- onSeek is required when in non-sequential mode.
    }


    // Not currently supporting compressed formats. Will need to add support for the "fact" chunk before we enable this.
    if (pFormat->format == DR_WAVE_FORMAT_EXTENSIBLE) {
        return DRWAV_FALSE;
    }
    if (pFormat->format == DR_WAVE_FORMAT_ADPCM || pFormat->format == DR_WAVE_FORMAT_DVI_ADPCM) {
        return DRWAV_FALSE;
    }


    drwav_zero_memory(pWav, sizeof(*pWav));
    pWav->onWrite = onWrite;
    pWav->onSeek = onSeek;
    pWav->pUserData = pUserData;
    pWav->fmt.formatTag = (drwav_uint16)pFormat->format;
    pWav->fmt.channels = (drwav_uint16)pFormat->channels;
    pWav->fmt.sampleRate = pFormat->sampleRate;
    pWav->fmt.avgBytesPerSec = (drwav_uint32)((pFormat->bitsPerSample * pFormat->sampleRate * pFormat->channels) / 8);
    pWav->fmt.blockAlign = (drwav_uint16)((pFormat->channels * pFormat->bitsPerSample) / 8);
    pWav->fmt.bitsPerSample = (drwav_uint16)pFormat->bitsPerSample;
    pWav->fmt.extendedSize = 0;
    pWav->isSequentialWrite = isSequential;


    size_t runningPos = 0;

    // The initial values for the "RIFF" and "data" chunks depends on whether or not we are initializing in sequential mode or not. In
    // sequential mode we set this to its final values straight away since they can be calculated from the total sample count. In non-
    // sequential mode we initialize it all to zero and fill it out in drwav_uninit() using a backwards seek.
    drwav_uint64 initialDataChunkSize = 0;
    if (isSequential) {
        initialDataChunkSize = (totalSampleCount * pWav->fmt.bitsPerSample) / 8;

        // The RIFF container has a limit on the number of samples. drwav is not allowing this. There's no practical limits for Wave64
        // so for the sake of simplicity I'm not doing any validation for that.
        if (pFormat->container == drwav_container_riff) {
            if (initialDataChunkSize > (0xFFFFFFFF - 36)) {
                return DRWAV_FALSE; // Not enough room to store every sample.
            }
        }
    }

    pWav->dataChunkDataSizeTargetWrite = initialDataChunkSize;


    // "RIFF" chunk.
    if (pFormat->container == drwav_container_riff) {
        drwav_uint32 chunkSizeRIFF = 36 + (drwav_uint32)initialDataChunkSize;   // +36 = "RIFF"+[RIFF Chunk Size]+"WAVE" + [sizeof "fmt " chunk]
        runningPos += pWav->onWrite(pUserData, "RIFF", 4);
        runningPos += pWav->onWrite(pUserData, &chunkSizeRIFF, 4);
        runningPos += pWav->onWrite(pUserData, "WAVE", 4);
    } else {
        drwav_uint64 chunkSizeRIFF = 80 + 24 + initialDataChunkSize;   // +24 because W64 includes the size of the GUID and size fields.
        runningPos += pWav->onWrite(pUserData, drwavGUID_W64_RIFF, 16);
        runningPos += pWav->onWrite(pUserData, &chunkSizeRIFF, 8);
        runningPos += pWav->onWrite(pUserData, drwavGUID_W64_WAVE, 16);
    }

    // "fmt " chunk.
    drwav_uint64 chunkSizeFMT;
    if (pFormat->container == drwav_container_riff) {
        chunkSizeFMT = 16;
        runningPos += pWav->onWrite(pUserData, "fmt ", 4);
        runningPos += pWav->onWrite(pUserData, &chunkSizeFMT, 4);
    } else {
        chunkSizeFMT = 40;
        runningPos += pWav->onWrite(pUserData, drwavGUID_W64_FMT, 16);
        runningPos += pWav->onWrite(pUserData, &chunkSizeFMT, 8);
    }

    runningPos += pWav->onWrite(pUserData, &pWav->fmt.formatTag,      2);
    runningPos += pWav->onWrite(pUserData, &pWav->fmt.channels,       2);
    runningPos += pWav->onWrite(pUserData, &pWav->fmt.sampleRate,     4);
    runningPos += pWav->onWrite(pUserData, &pWav->fmt.avgBytesPerSec, 4);
    runningPos += pWav->onWrite(pUserData, &pWav->fmt.blockAlign,     2);
    runningPos += pWav->onWrite(pUserData, &pWav->fmt.bitsPerSample,  2);

    pWav->dataChunkDataPos = runningPos;

    // "data" chunk.
    if (pFormat->container == drwav_container_riff) {
        drwav_uint32 chunkSizeDATA = (drwav_uint32)initialDataChunkSize;
        runningPos += pWav->onWrite(pUserData, "data", 4);
        runningPos += pWav->onWrite(pUserData, &chunkSizeDATA, 4);
    } else {
        drwav_uint64 chunkSizeDATA = 24 + initialDataChunkSize; // +24 because W64 includes the size of the GUID and size fields.
        runningPos += pWav->onWrite(pUserData, drwavGUID_W64_DATA, 16);
        runningPos += pWav->onWrite(pUserData, &chunkSizeDATA, 8);
    }


    // Simple validation.
    if (pFormat->container == drwav_container_riff) {
        if (runningPos != 20 + chunkSizeFMT + 8) {
            return DRWAV_FALSE;
        }
    } else {
        if (runningPos != 40 + chunkSizeFMT + 24) {
            return DRWAV_FALSE;
        }
    }
    


    // Set some properties for the client's convenience.
    pWav->container = pFormat->container;
    pWav->channels = (drwav_uint16)pFormat->channels;
    pWav->sampleRate = pFormat->sampleRate;
    pWav->bitsPerSample = (drwav_uint16)pFormat->bitsPerSample;
    pWav->translatedFormatTag = (drwav_uint16)pFormat->format;

    return DRWAV_TRUE;
}